

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

void ss_heapsort(sauchar_t *Td,saidx64_t *PA,saidx64_t *SA,saidx64_t size)

{
  saidx64_t sVar1;
  long in_RCX;
  saidx64_t *in_RDX;
  saidx64_t *in_RSI;
  sauchar_t *in_RDI;
  saidx64_t t;
  saidx64_t m;
  saidx64_t i;
  long local_30;
  long local_28;
  
  local_30 = in_RCX;
  if ((in_RCX % 2 == 0) &&
     (local_30 = in_RCX + -1,
     in_RDI[in_RSI[in_RDX[local_30 / 2]]] < in_RDI[in_RSI[in_RDX[local_30]]])) {
    sVar1 = in_RDX[local_30];
    in_RDX[local_30] = in_RDX[local_30 / 2];
    in_RDX[local_30 / 2] = sVar1;
  }
  local_28 = local_30 / 2;
  while (local_28 = local_28 + -1, -1 < local_28) {
    ss_fixdown(in_RDI,in_RSI,in_RDX,local_28,local_30);
  }
  local_28 = local_30;
  if (in_RCX % 2 == 0) {
    sVar1 = *in_RDX;
    *in_RDX = in_RDX[local_30];
    in_RDX[local_30] = sVar1;
    ss_fixdown(in_RDI,in_RSI,in_RDX,0,local_30);
  }
  while (local_28 = local_28 + -1, 0 < local_28) {
    sVar1 = *in_RDX;
    *in_RDX = in_RDX[local_28];
    ss_fixdown(in_RDI,in_RSI,in_RDX,0,local_28);
    in_RDX[local_28] = sVar1;
  }
  return;
}

Assistant:

static
void
ss_heapsort(const sauchar_t *Td, const saidx_t *PA, saidx_t *SA, saidx_t size) {
  saidx_t i, m;
  saidx_t t;

  m = size;
  if((size % 2) == 0) {
    m--;
    if(Td[PA[SA[m / 2]]] < Td[PA[SA[m]]]) { SWAP(SA[m], SA[m / 2]); }
  }

  for(i = m / 2 - 1; 0 <= i; --i) { ss_fixdown(Td, PA, SA, i, m); }
  if((size % 2) == 0) { SWAP(SA[0], SA[m]); ss_fixdown(Td, PA, SA, 0, m); }
  for(i = m - 1; 0 < i; --i) {
    t = SA[0], SA[0] = SA[i];
    ss_fixdown(Td, PA, SA, 0, i);
    SA[i] = t;
  }
}